

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_96::VerifyUnion
               (Verifier *v,Schema *schema,uint8_t utype,uint8_t *elem,Field *union_field)

{
  bool bVar1;
  uint uVar2;
  BaseType BVar3;
  int32_t iVar4;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this;
  Type *pTVar5;
  char *pcVar6;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVVar7;
  return_type this_01;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_02;
  return_type this_03;
  int __c;
  int __c_00;
  Schema *__s;
  return_type elem_obj;
  Type *elem_type;
  return_type fb_enum;
  Field *union_field_local;
  uint8_t *elem_local;
  uint8_t utype_local;
  Schema *schema_local;
  Verifier *v_local;
  
  if (utype == '\0') {
    v_local._7_1_ = true;
  }
  else {
    __s = schema;
    this = reflection::Schema::enums(schema);
    pTVar5 = reflection::Field::type(union_field);
    pcVar6 = reflection::Type::index(pTVar5,(char *)__s,__c);
    this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this,(uint)pcVar6);
    pVVar7 = reflection::Enum::values(this_00);
    uVar2 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::size(pVVar7);
    if (utype < uVar2) {
      pVVar7 = reflection::Enum::values(this_00);
      pcVar6 = (char *)(ulong)utype;
      this_01 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get
                          (pVVar7,(uint)utype);
      pTVar5 = reflection::EnumVal::union_type(this_01);
      BVar3 = reflection::Type::base_type(pTVar5);
      if (BVar3 == String) {
        v_local._7_1_ = VerifierTemplate<false>::VerifyString(v,(String *)elem);
      }
      else if (BVar3 == Obj) {
        this_02 = reflection::Schema::objects(schema);
        pcVar6 = reflection::Type::index(pTVar5,pcVar6,__c_00);
        this_03 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                            (this_02,(uint)pcVar6);
        bVar1 = reflection::Object::is_struct(this_03);
        if (bVar1) {
          iVar4 = reflection::Object::bytesize(this_03);
          v_local._7_1_ = VerifierTemplate<false>::VerifyFromPointer(v,elem,(long)iVar4);
        }
        else {
          v_local._7_1_ = VerifyObject(v,schema,this_03,(Table *)elem,true);
        }
      }
      else {
        v_local._7_1_ = false;
      }
    }
    else {
      v_local._7_1_ = false;
    }
  }
  return v_local._7_1_;
}

Assistant:

static bool VerifyUnion(flatbuffers::Verifier &v,
                        const reflection::Schema &schema, uint8_t utype,
                        const uint8_t *elem,
                        const reflection::Field &union_field) {
  if (!utype) return true;  // Not present.
  auto fb_enum = schema.enums()->Get(union_field.type()->index());
  if (utype >= fb_enum->values()->size()) return false;
  auto elem_type = fb_enum->values()->Get(utype)->union_type();
  switch (elem_type->base_type()) {
    case reflection::Obj: {
      auto elem_obj = schema.objects()->Get(elem_type->index());
      if (elem_obj->is_struct()) {
        return v.VerifyFromPointer(elem, elem_obj->bytesize());
      } else {
        return VerifyObject(v, schema, *elem_obj,
                            reinterpret_cast<const flatbuffers::Table *>(elem),
                            true);
      }
    }
    case reflection::String:
      return v.VerifyString(
          reinterpret_cast<const flatbuffers::String *>(elem));
    default: return false;
  }
}